

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_rtd(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 *ppTVar2;
  uint16_t uVar3;
  TCGv_i32 dest;
  TCGv_i32 *ppTVar4;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar3 = read_im16(env,s);
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar4 = s->writeback;
  }
  dest = gen_load(s,2,ppTVar4[7],0,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if ((s->writeback_mask & 0x80) == 0) {
    pTVar1 = s->uc->tcg_ctx;
    ppTVar2 = pTVar1->cpu_aregs;
    ppTVar4 = pTVar1->cpu_aregs;
  }
  else {
    ppTVar2 = s->writeback;
    ppTVar4 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar2[7],ppTVar4[7],(short)uVar3 + 4);
  gen_jmp(s,dest);
  return;
}

Assistant:

DISAS_INSN(rtd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;
    int16_t offset = read_im16(env, s);

    tmp = gen_load(s, OS_LONG, QREG_SP, 0, IS_USER(s));
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, QREG_SP, offset + 4);
    gen_jmp(s, tmp);
}